

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::CropParameter::InternalSerializeWithCachedSizesToArray
          (CropParameter *this,bool deterministic,uint8 *target)

{
  Rep *pRVar1;
  void *pvVar2;
  bool bVar3;
  byte *pbVar4;
  LogMessage *other;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    uVar5 = (ulong)this->axis_;
    pbVar4 = target + 1;
    *target = '\b';
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar4 = (byte)uVar6;
    target = pbVar4 + 1;
  }
  uVar7 = (this->offset_).current_size_;
  if (uVar7 != 0) {
    if ((this->offset_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      other = google::protobuf::internal::LogMessage::operator<<(&local_60,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    pRVar1 = (this->offset_).rep_;
    uVar5 = 1;
    if (1 < (int)uVar7) {
      uVar5 = (ulong)uVar7;
    }
    uVar6 = 0;
    do {
      uVar7 = pRVar1->elements[uVar6];
      *target = 0x10;
      pbVar4 = target + 1;
      uVar8 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar4 = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          pbVar4 = pbVar4 + 1;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar3);
      }
      *pbVar4 = (byte)uVar8;
      target = pbVar4 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CropParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.CropParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 axis = 1 [default = 2];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->axis(), target);
  }

  // repeated uint32 offset = 2;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(2, this->offset_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.CropParameter)
  return target;
}